

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O3

_Bool GlCheckExtension(char *extension)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  code *pcVar4;
  char *pcVar5;
  int iVar6;
  GLint i;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  pcVar4 = (code *)glXGetProcAddress("glGetStringi");
  glGetIntegerv(0x821d,&local_34);
  GlCheckErrors("glGetIntegerv(pname, &i)");
  GlCheckErrors("const GLint numExtensions = glGetInteger(GL_NUM_EXTENSIONS)");
  if (local_34 < 1) {
    bVar1 = false;
  }
  else {
    pcVar5 = (char *)(*pcVar4)(0x1f03,0);
    GlCheckErrors("const GLubyte *string = glGetStringi(GL_EXTENSIONS, i)");
    iVar2 = strcmp(pcVar5,extension);
    if (iVar2 == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = 1;
      do {
        iVar6 = iVar2;
        if (local_34 == iVar6) break;
        pcVar5 = (char *)(*pcVar4)(0x1f03,iVar6);
        GlCheckErrors("const GLubyte *string = glGetStringi(GL_EXTENSIONS, i)");
        iVar3 = strcmp(pcVar5,extension);
        iVar2 = iVar6 + 1;
      } while (iVar3 != 0);
      bVar1 = iVar6 < local_34;
    }
  }
  return bVar1;
}

Assistant:

static bool GlCheckExtension(const char *extension) {
#if defined(OS_WINDOWS) || defined(OS_LINUX)
    PFNGLGETSTRINGIPROC glGetStringi = (PFNGLGETSTRINGIPROC)GetExtension("glGetStringi");
#endif
    GL(const GLint numExtensions = glGetInteger(GL_NUM_EXTENSIONS));
    for (int i = 0; i < numExtensions; i++) {
        GL(const GLubyte *string = glGetStringi(GL_EXTENSIONS, i));
        if (strcmp((const char *)string, extension) == 0) {
            return true;
        }
    }
    return false;
}